

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O2

void bitbltsub(LispPTR *argv)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  LispPTR LVar6;
  bool bVar7;
  uint uVar8;
  LispPTR *pLVar9;
  LispPTR *pLVar10;
  LispPTR *pLVar11;
  int iVar12;
  uint uVar13;
  uint y;
  uint uVar14;
  uint x;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  DLword *pDVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint local_110;
  DLword grayword [4];
  uint local_dc;
  uint local_d8;
  
  pLVar9 = NativeAligned4FromLAddr(*argv);
  pLVar10 = NativeAligned4FromLAddr(argv[1]);
  uVar1 = (ushort)argv[2];
  uVar2 = (ushort)argv[3];
  pLVar11 = NativeAligned4FromLAddr(argv[4]);
  uVar3 = *(ushort *)((long)pLVar9 + 0x12);
  uVar4 = (ushort)pLVar9[4];
  if (uVar3 == 0 || uVar4 == 0) {
    return;
  }
  uVar21 = argv[5];
  x = uVar21 & 0xffff;
  y = argv[6] & 0xffff;
  uVar13 = (uint)REPLACE_atom;
  if (argv[9] != 0) {
    uVar13 = argv[9];
  }
  uVar19 = (uint)INPUT_atom;
  if (argv[8] != 0) {
    uVar19 = argv[8];
  }
  uVar8 = (uint)(uVar13 == INVERT_atom) * 3;
  if (uVar13 == ERASE_atom) {
    uVar8 = 1;
  }
  uVar15 = 2;
  if (uVar13 != PAINT_atom) {
    uVar15 = uVar8;
  }
  uVar5 = *(ushort *)((long)pLVar11 + 6);
  uVar13 = (uint)TEXTURE_atom;
  if (uVar19 == uVar13) {
    uVar8 = argv[10];
    LVar6 = argv[0xb];
    pDVar18 = Lisp_world + (uVar5 * y + *pLVar11);
    if ((uVar8 != 0) &&
       ((*(byte *)(((ulong)(uVar8 >> 8 & 0xffffe) + (long)MDStypetbl ^ 2) + 1) & 0x10) == 0)) {
      NativeAligned4FromLAddr(uVar8);
    }
    uVar20 = (ulong)(x >> 3) + (long)pDVar18;
    uVar14 = (uVar21 & 7) + ((uint)uVar20 & 3) * 8;
    uVar8 = 0;
    local_110 = -1 << (~(((char)uVar3 + (char)uVar14) - 1U & 0x1f) & 0x1f) &
                (-(uint)(uVar14 == 0) | ~(-1 << (-(char)uVar14 & 0x1fU)));
    uVar21 = uVar21 - LVar6 & 0xf;
    bVar7 = true;
    local_dc = 0;
    local_d8 = 0;
    goto LAB_0010a398;
  }
  if (((pLVar10 == pLVar11) && (uVar2 <= y)) && (y <= (uint)uVar2 + (uint)uVar4)) {
    if (uVar2 == y) {
      if ((x <= uVar1) || (uVar8 = (uint)uVar1 + (uint)uVar3, uVar8 <= x)) goto LAB_0010a037;
    }
    else {
      uVar8 = (uint)uVar1 + (uint)uVar3;
    }
    uVar16 = (ulong)(uVar8 - 1 >> 3);
    if (uVar8 == 0) {
      uVar16 = 0xffffffffffffffff;
    }
    iVar12 = x + uVar3;
    uVar20 = (ulong)(iVar12 - 1U >> 3);
    if (iVar12 == 0) {
      uVar20 = 0xffffffffffffffff;
    }
    pDVar18 = Lisp_world + ((uVar4 + y + -1) * (uint)uVar5 + *pLVar11);
    uVar20 = uVar20 + (long)pDVar18;
    iVar12 = (iVar12 - 1U & 7) + ((uint)uVar20 & 3) * 8;
    iVar17 = iVar12 - (uint)uVar3;
    uVar14 = iVar17 + 1U & 0x1f;
    local_110 = (-(uint)(uVar14 == 0) | ~(-1 << (-(char)uVar14 & 0x1fU))) &
                -1 << (~(byte)iVar12 & 0x1f);
    bVar7 = false;
    iVar12 = ((uVar8 - 1 & 7) +
             ((int)uVar16 +
              (int)Lisp_world +
              ((((uint)uVar2 + (uint)uVar4) - 1) * (uint)*(ushort *)((long)pLVar10 + 6) + *pLVar10)
              * 2 & 3) * 8) - (uint)uVar3;
    local_d8 = iVar17 - iVar12;
    uVar21 = iVar12 + 1U & 0x1f;
    uVar8 = iVar12 - iVar17 & 0x1f;
    local_dc = ~(-1 << (sbyte)uVar8);
  }
  else {
LAB_0010a037:
    pDVar18 = Lisp_world + (uVar5 * y + *pLVar11);
    uVar20 = (ulong)(x >> 3) + (long)pDVar18;
    uVar14 = (uVar21 & 7) + ((uint)uVar20 & 3) * 8;
    local_110 = -1 << (~(((char)uVar3 + (char)uVar14) - 1U & 0x1f) & 0x1f) &
                (-(uint)(uVar14 == 0) | -1 << (-(char)uVar14 & 0x1fU) ^ 0xffffffffU);
    uVar21 = (uVar1 & 7) +
             ((uint)(uVar1 >> 3) +
              (int)Lisp_world + ((uint)uVar2 * (uint)*(ushort *)((long)pLVar10 + 6) + *pLVar10) * 2
             & 3) * 8;
    local_d8 = uVar14 - uVar21;
    uVar8 = uVar21 - uVar14 & 0x1f;
    local_dc = -(uint)(uVar8 == 0) | ~(-1 << (sbyte)uVar8);
    bVar7 = true;
  }
  local_d8 = local_d8 & 0x1f;
LAB_0010a398:
  ScreenLocked = 1;
  iVar12 = 0x21 - (uint)uVar3;
  if (uVar4 == 0) {
    if ((DisplayRegion68k <= pDVar18) && (pDVar18 <= DISP_MAX_Address)) {
      flush_display_region(x,y,(uint)uVar3,0);
    }
    ScreenLocked = 0;
    return;
  }
  uVar16 = (ulong)uVar15;
  if (uVar19 == uVar13) {
    uVar8 = uVar21 - uVar14 & 0xf;
    if (iVar12 <= (int)uVar14) {
      (*(code *)(&DAT_0013a6e4 + *(int *)(&DAT_0013a6e4 + uVar16 * 4)))();
      return;
    }
  }
  else if (bVar7) {
    if (iVar12 <= (int)uVar14) {
      (*(code *)(&DAT_0013a694 + *(int *)(&DAT_0013a694 + uVar16 * 4)))();
      return;
    }
  }
  else if (iVar12 <= (int)uVar14) {
    (*(code *)(&DAT_0013a644 + *(int *)(&DAT_0013a644 + uVar16 * 4)))
              (local_d8,uVar16,&DAT_0013a644 + *(int *)(&DAT_0013a644 + uVar16 * 4),
               *(undefined4 *)(uVar20 & 0xfffffffffffffffc));
    return;
  }
  (*(code *)(&DAT_0013a6f4 + *(int *)(&DAT_0013a6f4 + uVar16 * 4)))
            (local_dc,uVar8,&DAT_0013a6f4 + *(int *)(&DAT_0013a6f4 + uVar16 * 4),local_110);
  return;
}

Assistant:

void bitbltsub(LispPTR *argv) {
  int sourcetype, operation;
  int sty, dty, texture, wxoffset, wyoffset;
  int h, w;
#ifdef REALCURSOR
  int displayflg = 0;
#endif
  int backwardflg = 0, sx, dx, srcbpl=2147483647, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0, num_gray = 0, curr_gray_line = 0;
  DLword grayword[4] = {0, 0, 0, 0};

  { /* Initialization code, in a block so it optimizes independently */
    LispPTR *args = argv;
    PILOTBBT *pbt;
    BITMAP *srcebm, *destbm;
    BITMAP *texture68k;
    DLword *base;

#ifdef INIT
    init_kbd_startup;
#endif

    pbt = (PILOTBBT *)NativeAligned4FromLAddr(args[0]);
    srcebm = (BITMAP *)NativeAligned4FromLAddr(args[1]);
    sx = (args[2] & 0xFFFF);
    sty = (args[3] & 0xFFFF);
    destbm = (BITMAP *)NativeAligned4FromLAddr(args[4]);
    dx = (args[5] & 0xFFFF);
    dty = (args[6] & 0xFFFF);
    sourcetype = (args[8] == NIL_PTR ? INPUT_atom : args[8]);
    operation = (args[9] == NIL_PTR ? REPLACE_atom : args[9]);

    w = pbt->pbtwidth;
    h = pbt->pbtheight;
    if ((h <= 0) || (w <= 0)) return;
    src_comp = bbsrc_type(sourcetype, operation);
    op = bbop(sourcetype, operation);

    dstbpl = destbm->bmrasterwidth << 4;

    if (sourcetype == TEXTURE_atom) {
      texture = args[10];
      wxoffset = (args[11] == NIL_PTR ? 0 : args[11] & 0xFFFF);
      wyoffset = (args[12] == NIL_PTR ? 0 : args[12] & 0xFFFF);
      sx = ((wxoffset) ? (dx - wxoffset) : dx) % BITSPERWORD;
      dstbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(destbm->bmbase, destbm->bmrasterwidth * dty));
      gray = 1;
      if (texture == NIL_PTR) { /* White Shade */
        grayword[0] = 0;
        srcbase = &grayword[0];
        num_gray = 1;
        curr_gray_line = 0;
        goto do_it_now;
      } else if (IsNumber(texture)) {
        if ((texture &= 0xffff) == 0) { /* White Shade */
          grayword[0] = 0;
          srcbase = &grayword[0];
          num_gray = 1;
          curr_gray_line = 0;
          goto do_it_now;
        } else if (texture == 0xffff) { /* Black Shade */
          grayword[0] = 0xFFFF;
          srcbase = &grayword[0];
          num_gray = 1;
          curr_gray_line = 0;
          goto do_it_now;
        } else { /* 4x4 */
          srcbase = base = (DLword *)(&grayword[0]);
          GETWORD(base++) = Expand4Bit(((texture >> 12) & 0xf));
          GETWORD(base++) = Expand4Bit(((texture >> 8) & 0xf));
          GETWORD(base++) = Expand4Bit(((texture >> 4) & 0xf));
          GETWORD(base++) = Expand4Bit((texture & 0xf));
          num_gray = 4;
          curr_gray_line = (dty + wyoffset) & 3;
          srcbase += curr_gray_line;
          goto do_it_now;
        }
      } else { /* A bitmap that is 16 bits wide. */
        texture68k = (BITMAP *)NativeAligned4FromLAddr(texture);
        srcbase = (DLword *)NativeAligned2FromLAddr(texture68k->bmbase);
        num_gray = min(texture68k->bmheight, 16);
        curr_gray_line = (dty + wyoffset) % num_gray;
        srcbase += curr_gray_line;
        goto do_it_now;
      }
    }
    /* ; INPUT or INVERT      */
    srcbpl = srcebm->bmrasterwidth << 4;

    /* compute flags */
    /* out for now
    if(srcebm == destbm)
    if(sty <= dty)
    if(dty <= (sty + h))
    if((sty != dty) || ((sx < dx) && (dx < (sx + w))))
                      backwardflg = T;
    out for now */
    /* compute flags */
    if (srcebm != destbm)
      ;
    else if (sty > dty)
      ;
    else if (dty > (sty + h))
      ;
    else if ((sty != dty) || ((sx < dx) && (dx < (sx + w))))
      backwardflg = T;

    if (backwardflg) {
      srcbase = (DLword *)NativeAligned2FromLAddr(
          ADDBASE(srcebm->bmbase, srcebm->bmrasterwidth * (sty + h - 1)));
      dstbase = (DLword *)NativeAligned2FromLAddr(
          ADDBASE(destbm->bmbase, destbm->bmrasterwidth * (dty + h - 1)));
      srcbpl = 0 - srcbpl;
      dstbpl = 0 - dstbpl;
    } else {
      srcbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(srcebm->bmbase, srcebm->bmrasterwidth * sty));
      dstbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(destbm->bmbase, destbm->bmrasterwidth * dty));
    }
#ifdef REALCURSOR
    displayflg = n_new_cursorin(srcbase, sx, sty, w, h);
#endif /* REALCURSOR */
  }

do_it_now:
#ifdef DOS
  currentdsp->device.locked++;
#else
  ScreenLocked = T;
#endif /* DOS */

#ifdef REALCURSOR
  displayflg |= n_new_cursorin(dstbase, dx, dty, w, h);
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    /* Copy the changed section of display bank to the frame buffer */
    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
      flush_display_region(dx, dty, w, h);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_region(dx, dty, w, h);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_region(dx, dty, w, h);
#endif /* XWINDOW */

#ifdef DOS
  /* Copy the changed section of display bank to the frame buffer */
  if (in_display_segment(dstbase)) {
    /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
    flush_display_region(dx, dty, w, h);
  }
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

#ifdef DOS
  currentdsp->device.locked--;
#else
  ScreenLocked = NIL;
#endif /* DOS */

}